

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

void Mpm_ObjRecycleCuts(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  int iVar1;
  int h;
  Mpm_Cut_t *pMVar2;
  
  h = Mpm_ObjCutList(p,pObj);
  while (h != 0) {
    pMVar2 = Mpm_CutFetch(p,h);
    if (pMVar2 == (Mpm_Cut_t *)0x0) break;
    iVar1 = pMVar2->hNext;
    Mmr_StepRecycle(p->pManCuts,h);
    h = iVar1;
  }
  Mpm_ObjSetCutList(p,pObj,0);
  return;
}

Assistant:

static inline void Mpm_ObjRecycleCuts( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut;
    int hCut, hNext;
    Mpm_ObjForEachCutSafe( p, pObj, hCut, pCut, hNext )
        Mmr_StepRecycle( p->pManCuts, hCut );
    Mpm_ObjSetCutList( p, pObj, 0 );
}